

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

int __thiscall NodeFS::GetNumberOfElements(NodeFS *this)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_28;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_20;
  iterator it;
  int nb_elements;
  NodeFS *this_local;
  
  it._M_current._5_3_ = 0;
  it._M_current._4_1_ = this->type_ != -1;
  local_20._M_current =
       (NodeFS **)std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::begin(&this->sub_node_);
  while( true ) {
    local_28._M_current =
         (NodeFS **)std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::end(&this->sub_node_);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
              operator*(&local_20);
    iVar2 = GetNumberOfElements(*ppNVar3);
    it._M_current._4_4_ = iVar2 + it._M_current._4_4_;
    __gnu_cxx::__normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
    operator++(&local_20);
  }
  return it._M_current._4_4_;
}

Assistant:

int NodeFS::GetNumberOfElements()
{
   int nb_elements = 0;
   if (type_ != -1) nb_elements++;
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      nb_elements += (*it)->GetNumberOfElements();
   }
   return nb_elements;
}